

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O3

void __thiscall
cbtDbvt::collideTTpersistentStack
          (cbtDbvt *this,cbtDbvtNode *root0,cbtDbvtNode *root1,ICollide *policy)

{
  sStkNN *psVar1;
  cbtDbvtNode *pcVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtNode *pcVar4;
  sStkNN *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (root1 != (cbtDbvtNode *)0x0 && root0 != (cbtDbvtNode *)0x0) {
    if (((this->m_stkStack).m_size < 0x80) && ((this->m_stkStack).m_capacity < 0x80)) {
      psVar5 = (sStkNN *)cbtAlignedAllocInternal(0x800,0x10);
      lVar6 = (long)(this->m_stkStack).m_size;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          *(undefined1 (*) [16])((long)&psVar5->a + lVar8) =
               *(undefined1 (*) [16])((long)&((this->m_stkStack).m_data)->a + lVar8);
          lVar8 = lVar8 + 0x10;
        } while (lVar6 * 0x10 != lVar8);
      }
      psVar1 = (this->m_stkStack).m_data;
      if ((psVar1 != (sStkNN *)0x0) && ((this->m_stkStack).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(psVar1);
      }
      (this->m_stkStack).m_ownsMemory = true;
      (this->m_stkStack).m_data = psVar5;
      (this->m_stkStack).m_capacity = 0x80;
    }
    (this->m_stkStack).m_size = 0x80;
    iVar10 = 1;
    iVar13 = 0x7c;
    psVar5 = (this->m_stkStack).m_data;
    psVar5->a = root0;
    psVar5->b = root1;
    do {
      psVar5 = (this->m_stkStack).m_data;
      lVar8 = (long)iVar10;
      iVar11 = iVar10 + -1;
      lVar6 = lVar8 + -1;
      pcVar2 = psVar5[lVar6].a;
      pcVar3 = psVar5[lVar6].b;
      if (iVar13 < iVar11) {
        iVar13 = (this->m_stkStack).m_size;
        iVar12 = iVar13 * 2;
        if ((iVar13 < iVar12) && ((this->m_stkStack).m_capacity < iVar12)) {
          if (iVar13 == 0) {
            psVar5 = (sStkNN *)0x0;
          }
          else {
            psVar5 = (sStkNN *)cbtAlignedAllocInternal((long)iVar13 << 5,0x10);
            lVar7 = (long)(this->m_stkStack).m_size;
            if (0 < lVar7) {
              lVar9 = 0;
              do {
                *(undefined1 (*) [16])((long)&psVar5->a + lVar9) =
                     *(undefined1 (*) [16])((long)&((this->m_stkStack).m_data)->a + lVar9);
                lVar9 = lVar9 + 0x10;
              } while (lVar7 * 0x10 != lVar9);
            }
          }
          psVar1 = (this->m_stkStack).m_data;
          if ((psVar1 != (sStkNN *)0x0) && ((this->m_stkStack).m_ownsMemory == true)) {
            cbtAlignedFreeInternal(psVar1);
          }
          (this->m_stkStack).m_ownsMemory = true;
          (this->m_stkStack).m_data = psVar5;
          (this->m_stkStack).m_capacity = iVar12;
        }
        iVar13 = iVar12 + -4;
        (this->m_stkStack).m_size = iVar12;
      }
      if (pcVar2 == pcVar3) {
        if ((pcVar2->field_2).childs[1] != (cbtDbvtNode *)0x0) {
          pcVar3 = (pcVar2->field_2).childs[0];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar6].a = pcVar3;
          psVar5[lVar6].b = pcVar3;
          pcVar3 = (pcVar2->field_2).childs[1];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar8].a = pcVar3;
          psVar5[lVar8].b = pcVar3;
          *(anon_union_16_3_f0e812c0_for_cbtDbvtNode_2 *)((this->m_stkStack).m_data + lVar8 + 1) =
               pcVar2->field_2;
          iVar11 = iVar10 + 2;
        }
      }
      else if (((((pcVar2->volume).mi.m_floats[0] <= (pcVar3->volume).mx.m_floats[0]) &&
                ((pcVar3->volume).mi.m_floats[0] <= (pcVar2->volume).mx.m_floats[0])) &&
               ((pcVar2->volume).mi.m_floats[1] <= (pcVar3->volume).mx.m_floats[1])) &&
              ((((pcVar3->volume).mi.m_floats[1] <= (pcVar2->volume).mx.m_floats[1] &&
                ((pcVar2->volume).mi.m_floats[2] <= (pcVar3->volume).mx.m_floats[2])) &&
               ((pcVar3->volume).mi.m_floats[2] <= (pcVar2->volume).mx.m_floats[2])))) {
        if ((pcVar2->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          if ((pcVar3->field_2).childs[1] == (cbtDbvtNode *)0x0) {
            (*policy->_vptr_ICollide[2])(policy,pcVar2);
          }
          else {
            pcVar4 = (pcVar3->field_2).childs[0];
            psVar5 = (this->m_stkStack).m_data;
            psVar5[lVar6].a = pcVar2;
            psVar5[lVar6].b = pcVar4;
            pcVar3 = (pcVar3->field_2).childs[1];
            psVar5 = (this->m_stkStack).m_data;
            psVar5[lVar8].a = pcVar2;
            psVar5[lVar8].b = pcVar3;
            iVar11 = iVar10 + 1;
          }
        }
        else if ((pcVar3->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar6].a = (pcVar2->field_2).childs[0];
          psVar5[lVar6].b = pcVar3;
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar8].a = (pcVar2->field_2).childs[1];
          psVar5[lVar8].b = pcVar3;
          iVar11 = iVar10 + 1;
        }
        else {
          pcVar4 = (pcVar3->field_2).childs[0];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar6].a = (pcVar2->field_2).childs[0];
          psVar5[lVar6].b = pcVar4;
          pcVar4 = (pcVar3->field_2).childs[0];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar8].a = (pcVar2->field_2).childs[1];
          psVar5[lVar8].b = pcVar4;
          pcVar4 = (pcVar3->field_2).childs[1];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar8 + 1].a = (pcVar2->field_2).childs[0];
          psVar5[lVar8 + 1].b = pcVar4;
          pcVar3 = (pcVar3->field_2).childs[1];
          psVar5 = (this->m_stkStack).m_data;
          psVar5[lVar8 + 2].a = (pcVar2->field_2).childs[1];
          psVar5[lVar8 + 2].b = pcVar3;
          iVar11 = iVar10 + 3;
        }
      }
      iVar10 = iVar11;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTTpersistentStack(const cbtDbvtNode* root0,
											 const cbtDbvtNode* root1,
											 DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
	if (root0 && root1)
	{
		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 4;

		m_stkStack.resize(DOUBLE_STACKSIZE);
		m_stkStack[0] = sStkNN(root0, root1);
		do
		{
			sStkNN p = m_stkStack[--depth];
			if (depth > treshold)
			{
				m_stkStack.resize(m_stkStack.size() * 2);
				treshold = m_stkStack.size() - 4;
			}
			if (p.a == p.b)
			{
				if (p.a->isinternal())
				{
					m_stkStack[depth++] = sStkNN(p.a->childs[0], p.a->childs[0]);
					m_stkStack[depth++] = sStkNN(p.a->childs[1], p.a->childs[1]);
					m_stkStack[depth++] = sStkNN(p.a->childs[0], p.a->childs[1]);
				}
			}
			else if (Intersect(p.a->volume, p.b->volume))
			{
				if (p.a->isinternal())
				{
					if (p.b->isinternal())
					{
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b->childs[1]);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b->childs[1]);
					}
					else
					{
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b);
					}
				}
				else
				{
					if (p.b->isinternal())
					{
						m_stkStack[depth++] = sStkNN(p.a, p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a, p.b->childs[1]);
					}
					else
					{
						policy.Process(p.a, p.b);
					}
				}
			}
		} while (depth);
	}
}